

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderHeatmap<unsigned_char,ImPlot::TransformerLinLin>
               (TransformerLinLin transformer,ImDrawList *DrawList,uchar *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max,bool reverse_y)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  byte bVar3;
  float fVar4;
  ImPlotPlot *pIVar5;
  undefined1 auVar6 [16];
  uchar *puVar7;
  byte bVar8;
  ImU32 col;
  ImPlotContext *gp;
  byte bVar9;
  ImPlotPoint *pIVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  ImVec4 IVar21;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  double local_158;
  double dStack_150;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  long local_120;
  long local_118;
  ulong local_110;
  double local_108;
  double local_100;
  ImDrawList *local_f8;
  uchar *local_f0;
  RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLinLin> local_e8;
  undefined1 local_c8 [56];
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  
  if ((((scale_min == 0.0) && (!NAN(scale_min))) && (scale_max == 0.0)) && (!NAN(scale_max))) {
    bVar8 = *values;
    bVar9 = bVar8;
    if (1 < cols * rows) {
      uVar13 = 1;
      do {
        bVar3 = values[uVar13];
        if (bVar3 < bVar9) {
          bVar9 = bVar3;
        }
        if (bVar8 < bVar3) {
          bVar8 = bVar3;
        }
        uVar13 = uVar13 + 1;
      } while ((uint)(cols * rows) != uVar13);
    }
    scale_min = (double)bVar9;
    scale_max = (double)bVar8;
  }
  if ((scale_min != scale_max) || (NAN(scale_min) || NAN(scale_max))) {
    if (reverse_y) {
      dVar19 = -1.0;
      pIVar10 = bounds_max;
    }
    else {
      dVar19 = 1.0;
      pIVar10 = bounds_min;
    }
    local_158 = (double)cols;
    dStack_150 = (double)rows;
    local_130 = pIVar10->y;
    local_c8._8_4_ = cols * rows;
    local_90 = bounds_min->x;
    auVar18._0_8_ = bounds_max->x - local_90;
    auVar18._8_8_ = bounds_max->y - bounds_min->y;
    auVar6._8_8_ = dStack_150;
    auVar6._0_8_ = local_158;
    local_c8._40_16_ = divpd(auVar18,auVar6);
    local_78 = local_c8._40_8_ * 0.5;
    dStack_70 = local_c8._48_8_ * 0.5;
    pIVar5 = GImPlot->CurrentPlot;
    fVar4 = (float)pIVar5->CurrentYAxis;
    local_c8._0_8_ = values;
    local_c8._12_4_ = rows;
    local_c8._16_4_ = cols;
    local_c8._24_8_ = scale_min;
    local_c8._32_8_ = scale_max;
    local_88 = local_130;
    local_80 = dVar19;
    switch(GImPlot->Scales[(int)fVar4]) {
    case 0:
      local_e8.Transformer = (TransformerLinLin *)&local_170;
      local_170.x = fVar4;
      local_e8.Getter = (GetterHeatmap<unsigned_char> *)local_c8;
      local_e8.Prims = local_c8._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLinLin>>
                (&local_e8,DrawList,&pIVar5->PlotRect);
      break;
    case 1:
      local_e8.Transformer = (TransformerLinLin *)&local_170;
      local_170.x = fVar4;
      local_e8.Getter = (GetterHeatmap<unsigned_char> *)local_c8;
      local_e8.Prims = local_c8._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLogLin>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLogLin> *)
                 &local_e8,DrawList,&pIVar5->PlotRect);
      break;
    case 2:
      local_e8.Transformer = (TransformerLinLin *)&local_170;
      local_170.x = fVar4;
      local_e8.Getter = (GetterHeatmap<unsigned_char> *)local_c8;
      local_e8.Prims = local_c8._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLinLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLinLog> *)
                 &local_e8,DrawList,&pIVar5->PlotRect);
      break;
    case 3:
      local_e8.Transformer = (TransformerLinLin *)&local_170;
      local_170.x = fVar4;
      local_e8.Getter = (GetterHeatmap<unsigned_char> *)local_c8;
      local_e8.Prims = local_c8._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLogLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLogLog> *)
                 &local_e8,DrawList,&pIVar5->PlotRect);
    }
    if ((fmt != (char *)0x0) && (0 < rows)) {
      dVar16 = (bounds_max->x - bounds_min->x) / local_158;
      local_138 = (bounds_max->y - bounds_min->y) / dStack_150;
      lVar11 = (long)transformer.YAxis;
      local_110 = (ulong)(uint)cols;
      local_140 = local_138 * 0.5;
      dVar20 = dVar16 * 0.5;
      lVar14 = lVar11 << 4;
      local_128 = 0.0;
      local_15c = 0;
      local_160 = 0;
      lVar12 = lVar11;
      local_168 = rows;
      local_164 = cols;
      local_120 = lVar14;
      local_118 = lVar11;
      local_108 = dVar20;
      local_100 = dVar16;
      local_f8 = DrawList;
      do {
        if (0 < cols) {
          local_68 = (local_138 * local_128 + local_140) * dVar19 + local_130;
          uStack_60 = 0;
          local_f0 = values + local_160;
          local_158 = 0.0;
          lVar15 = 0;
          do {
            puVar7 = local_f0;
            uVar2 = *(undefined8 *)((long)&GImPlot->PixelRange[0].Min.x + lVar14);
            local_48 = (float)(GImPlot->Mx *
                               ((local_158 * dVar16 + bounds_min->x + dVar20) -
                               (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)(float)uVar2);
            fStack_44 = (float)(GImPlot->My[lVar12] *
                                (local_68 - GImPlot->CurrentPlot->YAxis[lVar11].Range.Min) +
                               (double)(float)((ulong)uVar2 >> 0x20));
            uStack_40 = 0;
            sprintf((char *)&local_e8,fmt,(ulong)local_f0[lVar15]);
            IVar1 = ImGui::CalcTextSize((char *)&local_e8,(char *)0x0,false,-1.0);
            local_58._8_4_ = extraout_XMM0_Dc;
            local_58._0_4_ = IVar1.x;
            local_58._4_4_ = IVar1.y;
            local_58._12_4_ = extraout_XMM0_Dd;
            dVar20 = ((double)puVar7[lVar15] - scale_min) / (scale_max - scale_min);
            dVar16 = 1.0;
            if (dVar20 <= 1.0) {
              dVar16 = dVar20;
            }
            IVar21 = SampleColormap((float)(double)(~-(ulong)(dVar20 < 0.0) & (ulong)dVar16),-1);
            local_170.y = (float)local_58._4_4_ * -0.5 + fStack_44;
            local_170.x = (float)local_58._0_4_ * -0.5 + local_48;
            ImDrawList::AddText(local_f8,&local_170,
                                -(uint)(IVar21.z * 0.114 + IVar21.x * 0.299 + IVar21.y * 0.587 <=
                                       0.5) | 0xff000000,(char *)&local_e8,(char *)0x0);
            local_158 = local_158 + 1.0;
            lVar15 = lVar15 + 1;
            lVar12 = local_118;
            lVar14 = local_120;
            dVar20 = local_108;
            dVar16 = local_100;
          } while ((int)local_110 != (int)lVar15);
          local_160 = local_160 + (int)lVar15;
          rows = local_168;
          cols = local_164;
        }
        local_128 = local_128 + 1.0;
        local_15c = local_15c + 1;
      } while (local_15c != rows);
    }
  }
  else {
    IVar1 = GImPlot->PixelRange[transformer.YAxis].Min;
    dVar16 = (double)IVar1.x;
    dVar17 = (double)IVar1.y;
    dVar19 = (GImPlot->CurrentPlot->XAxis).Range.Min;
    dVar20 = GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min;
    local_c8._0_4_ = (float)((bounds_min->x - dVar19) * GImPlot->Mx + dVar16);
    local_c8._4_4_ = (float)((bounds_min->y - dVar20) * GImPlot->My[transformer.YAxis] + dVar17);
    local_e8.Getter =
         (GetterHeatmap<unsigned_char> *)
         CONCAT44((float)((bounds_max->y - dVar20) * GImPlot->My[transformer.YAxis] + dVar17),
                  (float)((bounds_max->x - dVar19) * GImPlot->Mx + dVar16));
    col = GetColormapColorU32(0,(GImPlot->Style).Colormap);
    ImDrawList::AddRectFilled(DrawList,(ImVec2 *)local_c8,(ImVec2 *)&local_e8,col,0.0,0);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}